

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O3

void rx__uint_assess_comparison
               (rx_context *context,rx__uint x1,rx__uint x2,rx__op op,char *expr1,char *expr2,
               char *file,int line,rx_severity severity,char *failure_fmt,...)

{
  rx_status rVar1;
  char *in_RAX;
  char *s;
  char *s_00;
  ulong uVar2;
  char *pcVar3;
  size_t rx__length;
  char *__size;
  char *diagnostic_msg;
  
  if (context == (rx_context *)0x0) {
    __assert_fail("context != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x160a,
                  "void rx__uint_assess_comparison(struct rx_context *, rx__uint, rx__uint, enum rx__op, const char *, const char *, const char *, int, enum rx_severity, const char *, ...)"
                 );
  }
  uVar2 = x2 & 0xffffffff;
  if (x1 == 1) {
    s = (char *)0x0;
    pcVar3 = (char *)0x1;
    rVar1 = rx_handle_test_result
                      ((rx_context *)context->summary,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/lang/token.c"
                       ,(int)x2,RX_NONFATAL,(char *)0x0,in_RAX);
    s_00 = (char *)0x0;
    goto LAB_001055f0;
  }
  pcVar3 = (char *)0x0;
  rVar1 = rx__str_initialize((size_t *)&stack0xffffffffffffffc8,(char *)0x0,
                             "`%s` is expected to be %s `%s`","tokenizer.error_count","equal to","1"
                            );
  __size = in_RAX;
  if (rVar1 == RX_SUCCESS) {
    s = (char *)malloc((size_t)in_RAX);
    if (s == (char *)0x0) {
      rx__log(RX_LOG_LEVEL_ALL,pcVar3,0x1638,"failed to allocate the string (%lu bytes)\n",in_RAX);
      goto LAB_0010555e;
    }
    pcVar3 = s;
    rVar1 = rx__str_initialize((size_t *)&stack0xffffffffffffffc8,s,"`%s` is expected to be %s `%s`"
                               ,"tokenizer.error_count","equal to","1");
    if (rVar1 != RX_SUCCESS) {
      free(s);
      goto LAB_0010555e;
    }
  }
  else {
LAB_0010555e:
    s = (char *)0x0;
    rx__log(RX_LOG_LEVEL_ALL,pcVar3,0x1642,
            "failed to create the failure message for the unsigned integer comparison test located at %s:%d\n"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/lang/token.c"
            ,uVar2);
  }
  pcVar3 = (char *)0x0;
  rVar1 = rx__str_initialize((size_t *)&stack0xffffffffffffffc8,(char *)0x0,"%lu %s %lu",x1,"==",1);
  diagnostic_msg = __size;
  if (rVar1 == RX_SUCCESS) {
    s_00 = (char *)malloc((size_t)__size);
    if (s_00 == (char *)0x0) {
      rx__log(RX_LOG_LEVEL_ALL,pcVar3,0x164c,"failed to allocate the string (%lu bytes)\n",__size);
      goto LAB_001055ae;
    }
    pcVar3 = s_00;
    rVar1 = rx__str_initialize((size_t *)&stack0xffffffffffffffc8,s_00,"%lu %s %lu",x1,"==",1);
    if (rVar1 != RX_SUCCESS) {
      free(s_00);
      goto LAB_001055ae;
    }
  }
  else {
LAB_001055ae:
    s_00 = (char *)0x0;
    rx__log(RX_LOG_LEVEL_ALL,pcVar3,0x1652,
            "failed to create the diagnostic message for the unsigned integer comparison test located at %s:%d\n"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/lang/token.c"
            ,uVar2);
  }
  pcVar3 = (char *)0x0;
  rVar1 = rx_handle_test_result
                    ((rx_context *)context->summary,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/lang/token.c"
                     ,(int)x2,(rx_severity)s,s_00,diagnostic_msg);
LAB_001055f0:
  if (rVar1 != RX_SUCCESS) {
    rx__log(RX_LOG_LEVEL_ALL,pcVar3,0x165d,
            "failed to handle the test result for the unsigned integer comparison test located at %s:%d\n"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/lang/token.c"
            ,uVar2);
  }
  free(s);
  free(s_00);
  if (x1 == 1) {
    return;
  }
  longjmp((__jmp_buf_tag *)context,1);
}

Assistant:

static void
rx__uint_assess_comparison(struct rx_context *context,
                           rx__uint x1,
                           rx__uint x2,
                           enum rx__op op,
                           const char *expr1,
                           const char *expr2,
                           const char *file,
                           int line,
                           enum rx_severity severity,
                           const char *failure_fmt,
                           ...)
{
    int result;
    char *failure_msg;
    char *diagnostic_msg;

    RX_ASSERT(context != NULL);
    RX_ASSERT(expr1 != NULL);
    RX_ASSERT(expr2 != NULL);
    RX_ASSERT(file != NULL);

    switch (op) {
        case RX__OP_EQUAL:
            result = x1 == x2;
            break;
        case RX__OP_NOT_EQUAL:
            result = x1 != x2;
            break;
        case RX__OP_GREATER:
            result = x1 > x2;
            break;
        case RX__OP_LESSER:
            result = x1 < x2;
            break;
        case RX__OP_GREATER_OR_EQUAL:
            result = x1 >= x2;
            break;
        case RX__OP_LESSER_OR_EQUAL:
            result = x1 <= x2;
            break;
        default:
            RX_ASSERT(0);
            result = 0;
            break;
    }

    if (result) {
        failure_msg = NULL;
        diagnostic_msg = NULL;
    } else {
        enum rx_status status;
        const char *op_symbol;

        if (failure_fmt == NULL) {
            const char *op_name;

            rx__op_get_name(&op_name, op);
            RX__STR_CREATE_3(status,
                             failure_msg,
                             "`%s` is expected to be %s `%s`",
                             expr1,
                             op_name,
                             expr2);
        } else {
            RX__STR_CREATE_VA_LIST(status, failure_msg, failure_fmt);
        }

        if (status != RX_SUCCESS) {
            RX__LOG_DEBUG_2("failed to create the failure message for "
                            "the unsigned integer comparison test located at "
                            "%s:%d\n",
                            file,
                            line);
            failure_msg = NULL;
        }

        rx__op_get_symbol(&op_symbol, op);
        RX__STR_CREATE_3(status,
                         diagnostic_msg,
                         "%lu %s %lu",
                         (unsigned long)x1,
                         op_symbol,
                         (unsigned long)x2);
        if (status != RX_SUCCESS) {
            RX__LOG_DEBUG_2("failed to create the diagnostic message for "
                            "the unsigned integer comparison test located at "
                            "%s:%d\n",
                            file,
                            line);
            diagnostic_msg = NULL;
        }
    }

    if (rx_handle_test_result(
            context, result, file, line, severity, failure_msg, diagnostic_msg)
        != RX_SUCCESS) {
        RX__LOG_DEBUG_2("failed to handle the test result for the unsigned "
                        "integer comparison test located at %s:%d\n",
                        file,
                        line);
    }

    RX_FREE(failure_msg);
    RX_FREE(diagnostic_msg);

    if (!result && severity == RX_FATAL) {
        rx_abort(context);
    }
}